

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathRect
          (ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawCornerFlags rounding_corners)

{
  uint in_ECX;
  float *in_RDX;
  float *in_RSI;
  ImVec2 *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float rounding_bl;
  float rounding_br;
  float rounding_tr;
  float rounding_tl;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  float local_98;
  float local_90;
  undefined4 in_stack_ffffffffffffff7c;
  int a_max_of_12;
  int a_min_of_12;
  float radius;
  undefined4 in_stack_ffffffffffffff90;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  uint local_20;
  float local_1c;
  float *local_18;
  float *local_10;
  
  local_20 = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  fVar1 = ImFabs(*in_RDX - *in_RSI);
  a_min_of_12 = 0x3f800000;
  radius = 0.5;
  if ((local_20 & 3) != 3 && (local_20 & 0xc) != 0xc) {
    radius = 1.0;
  }
  fVar1 = ImMin<float>(in_XMM0_Da,fVar1 * radius + -1.0);
  local_1c = fVar1;
  fVar2 = ImFabs(local_18[1] - local_10[1]);
  a_max_of_12 = CONCAT13(1,(int3)in_stack_ffffffffffffff7c);
  if ((local_20 & 5) != 5) {
    a_max_of_12 = CONCAT13((local_20 & 10) == 10,(int3)in_stack_ffffffffffffff7c);
  }
  local_90 = 0.5;
  if ((char)((uint)a_max_of_12 >> 0x18) == '\0') {
    local_90 = 1.0;
  }
  local_1c = ImMin<float>(fVar1,fVar2 * local_90 + -1.0);
  if ((local_1c <= 0.0) || (local_20 == 0)) {
    PathLineTo((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    ImVec2::ImVec2(&local_28,*local_18,local_10[1]);
    PathLineTo((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    PathLineTo((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    ImVec2::ImVec2(&local_30,*local_10,local_18[1]);
    PathLineTo((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  else {
    local_98 = local_1c;
    if ((local_20 & 1) == 0) {
      local_98 = 0.0;
    }
    local_34 = local_98;
    local_38 = local_1c;
    if ((local_20 & 2) == 0) {
      local_38 = 0.0;
    }
    local_3c = local_1c;
    if ((local_20 & 8) == 0) {
      local_3c = 0.0;
    }
    local_40 = local_1c;
    if ((local_20 & 4) == 0) {
      local_40 = 0.0;
    }
    ImVec2::ImVec2(&local_48,*local_10 + local_98,local_10[1] + local_98);
    PathArcToFast((ImDrawList *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff90),in_RDI,radius,
                  a_min_of_12,a_max_of_12);
    ImVec2::ImVec2(&local_50,*local_18 - local_38,local_10[1] + local_38);
    PathArcToFast((ImDrawList *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff90),in_RDI,radius,
                  a_min_of_12,a_max_of_12);
    ImVec2::ImVec2(&local_58,*local_18 - local_3c,local_18[1] - local_3c);
    PathArcToFast((ImDrawList *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff90),in_RDI,radius,
                  a_min_of_12,a_max_of_12);
    ImVec2::ImVec2(&local_60,*local_10 + local_40,local_18[1] - local_40);
    PathArcToFast((ImDrawList *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff90),in_RDI,radius,
                  a_min_of_12,a_max_of_12);
  }
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawCornerFlags rounding_corners)
{
    rounding = ImMin(rounding, ImFabs(b.x - a.x) * ( ((rounding_corners & ImDrawCornerFlags_Top)  == ImDrawCornerFlags_Top)  || ((rounding_corners & ImDrawCornerFlags_Bot)   == ImDrawCornerFlags_Bot)   ? 0.5f : 1.0f ) - 1.0f);
    rounding = ImMin(rounding, ImFabs(b.y - a.y) * ( ((rounding_corners & ImDrawCornerFlags_Left) == ImDrawCornerFlags_Left) || ((rounding_corners & ImDrawCornerFlags_Right) == ImDrawCornerFlags_Right) ? 0.5f : 1.0f ) - 1.0f);

    if (rounding <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (rounding_corners & ImDrawCornerFlags_TopLeft) ? rounding : 0.0f;
        const float rounding_tr = (rounding_corners & ImDrawCornerFlags_TopRight) ? rounding : 0.0f;
        const float rounding_br = (rounding_corners & ImDrawCornerFlags_BotRight) ? rounding : 0.0f;
        const float rounding_bl = (rounding_corners & ImDrawCornerFlags_BotLeft) ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}